

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_interface.cpp
# Opt level: O2

MachineConfiguration * MT32Emu::findMachineConfiguration(char *machine_id)

{
  ulong uVar1;
  int iVar2;
  ulong in_RAX;
  MachineConfiguration **ppMVar3;
  char *__s1;
  Bit32u i;
  ulong uVar4;
  Bit32u configurationCount;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  ppMVar3 = MachineConfiguration::getAllMachineConfigurations((Bit32u *)((long)&uStack_28 + 4));
  uVar1 = 0;
  do {
    uVar4 = uVar1;
    if (uStack_28 >> 0x20 <= uVar4) {
      return (MachineConfiguration *)0x0;
    }
    __s1 = MachineConfiguration::getMachineID(ppMVar3[uVar4]);
    iVar2 = strcmp(__s1,machine_id);
    uVar1 = uVar4 + 1;
  } while (iVar2 != 0);
  return ppMVar3[uVar4];
}

Assistant:

static const MachineConfiguration *findMachineConfiguration(const char *machine_id) {
	Bit32u configurationCount;
	const MachineConfiguration * const *configurations = MachineConfiguration::getAllMachineConfigurations(&configurationCount);
	for (Bit32u i = 0; i < configurationCount; i++) {
		if (!strcmp(configurations[i]->getMachineID(), machine_id)) return configurations[i];
	}
	return NULL;
}